

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_type(FILE *out,Type *type,char should_print_struct_union)

{
  char *__format;
  char should_print_struct_union_local;
  Type *type_local;
  FILE *out_local;
  
  print_type_qualifier(out,type);
  switch(type->specifier) {
  case TS_VOID:
    fprintf((FILE *)out,"void");
    break;
  case TS_CHAR:
    fprintf((FILE *)out,"char");
    break;
  case TS_INT:
    fprintf((FILE *)out,"int");
    break;
  case TS_FLOAT:
    fprintf((FILE *)out,"float");
    break;
  case TS_DOUBLE:
    fprintf((FILE *)out,"double");
    break;
  case TS_STRUCT:
  case TS_UNION:
    if (should_print_struct_union == '\0') {
      __format = "union";
      if (type->specifier == TS_STRUCT) {
        __format = "struct";
      }
      fprintf((FILE *)out,__format);
    }
    else {
      print_struct_union(out,*(Struct_Union **)(type + 1));
    }
    break;
  case TS_ENUM:
    print_enumeration(out,*(Enum **)(type + 1));
    break;
  case TS_POINTER:
    fprintf((FILE *)out,"pointer to ");
    print_type(out,(Type *)type[1].node,'\0');
    break;
  case TS_ARRAY:
    fprintf((FILE *)out,"array [%zu] of ",type[1].node);
    print_type(out,*(Type **)(type + 2),should_print_struct_union);
    break;
  case TS_FUNC:
    fprintf((FILE *)out,"function taking arguments (");
    print_function_args(out,(Type_Function *)type);
    fprintf((FILE *)out,") returning ");
    print_type(out,*(Type **)(type + 1),should_print_struct_union);
    break;
  case TS_BITFIELD:
    fprintf((FILE *)out,"%zu bits of ",*(undefined8 *)(type + 1));
    print_type(out,(Type *)type[1].node,should_print_struct_union);
    break;
  case TS_NONE:
    fprintf((FILE *)out,"NONE");
    break;
  case TS_ERROR:
    fprintf((FILE *)out,"ERROR!");
    break;
  default:
    __assert_fail("!\"reached end of switch\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/backend/print/print.c"
                  ,0x1b1,"void print_type(FILE *, struct Type *, char)");
  }
  return;
}

Assistant:

void print_type(FILE *out,struct Type *type,char should_print_struct_union)
{
	print_type_qualifier(out,type);
	switch(type->specifier)
	{
		case TS_VOID:
			fprintf(out,"void");return;
		case TS_CHAR:
			fprintf(out,"char");return;
		case TS_INT:
			fprintf(out,"int");return;
		case TS_FLOAT:
			fprintf(out,"float");return;
		case TS_DOUBLE:
			fprintf(out,"double");return;
		case TS_UNION:
		case TS_STRUCT:
			if(should_print_struct_union)
			{
				print_struct_union(out,((struct Type_Struct_Union*)type)->struct_union);
			}else
			{
				fprintf(out,(type->specifier==TS_STRUCT?"struct":"union"));
			}
			return;
		case TS_ENUM:
			print_enumeration(out,((struct Type_Enum*)type)->enumeration);
			return;
		case TS_POINTER:
			fprintf(out,"pointer to ");
			print_type(out,((struct Type_Pointer*)type)->points_to,0);
			return;
		case TS_ARRAY:
			fprintf(out,"array [%zu] of ",((struct Type_Array*)type)->number_of_elements);
			print_type(out,((struct Type_Array*)type)->is_array_of,should_print_struct_union);
			return;
		case TS_FUNC:
			fprintf(out,"function taking arguments (");
			print_function_args(out,(struct Type_Function*)type);
			fprintf(out,") returning ");
			print_type(out,((struct Type_Function*)type)->return_type,should_print_struct_union);
			return;
		case TS_BITFIELD:
			fprintf(out,"%zu bits of ",((struct Type_Bit_Field*)type)->number_of_bits);
			print_type(out,((struct Type_Bit_Field*)type)->base,should_print_struct_union);
			return;
		case TS_NONE:
			fprintf(out,"NONE");return;
		case TS_ERROR:
			fprintf(out,"ERROR!");return;

	}
	assert(!"reached end of switch");
}